

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaHash.c
# Opt level: O0

int * Gia_ManHashFind(Gia_Man_t *p,int iLit0,int iLit1,int iLitC)

{
  int iVar1;
  Gia_Obj_t *local_50;
  Gia_Obj_t *local_40;
  int *local_30;
  int *pPlace;
  Gia_Obj_t *pThis;
  int iLitC_local;
  int iLit1_local;
  int iLit0_local;
  Gia_Man_t *p_local;
  
  local_30 = p->pHTable;
  iVar1 = Gia_ManHashOne(iLit0,iLit1,iLitC,p->nHTable);
  local_30 = local_30 + iVar1;
  if ((p->pMuxes == (uint *)0x0) && (iLit1 <= iLit0)) {
    __assert_fail("p->pMuxes || iLit0 < iLit1",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaHash.c"
                  ,0x3a,"int *Gia_ManHashFind(Gia_Man_t *, int, int, int)");
  }
  if ((iLit1 <= iLit0) &&
     ((iVar1 = Abc_LitIsCompl(iLit0), iVar1 != 0 || (iVar1 = Abc_LitIsCompl(iLit1), iVar1 != 0)))) {
    __assert_fail("iLit0 < iLit1 || (!Abc_LitIsCompl(iLit0) && !Abc_LitIsCompl(iLit1))",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaHash.c"
                  ,0x3b,"int *Gia_ManHashFind(Gia_Man_t *, int, int, int)");
  }
  if ((iLitC != -1) && (iVar1 = Abc_LitIsCompl(iLit1), iVar1 != 0)) {
    __assert_fail("iLitC == -1 || !Abc_LitIsCompl(iLit1)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaHash.c"
                  ,0x3c,"int *Gia_ManHashFind(Gia_Man_t *, int, int, int)");
  }
  if (*local_30 == 0) {
    local_40 = (Gia_Obj_t *)0x0;
  }
  else {
    iVar1 = Abc_Lit2Var(*local_30);
    local_40 = Gia_ManObj(p,iVar1);
  }
  pPlace = (int *)local_40;
  while ((pPlace != (int *)0x0 &&
         (((iVar1 = Gia_ObjFaninLit0p(p,(Gia_Obj_t *)pPlace), iVar1 != iLit0 ||
           (iVar1 = Gia_ObjFaninLit1p(p,(Gia_Obj_t *)pPlace), iVar1 != iLit1)) ||
          ((p->pMuxes != (uint *)0x0 &&
           (iVar1 = Gia_ObjFaninLit2p(p,(Gia_Obj_t *)pPlace), iVar1 != iLitC))))))) {
    local_30 = pPlace + 2;
    if (*local_30 == 0) {
      local_50 = (Gia_Obj_t *)0x0;
    }
    else {
      iVar1 = Abc_Lit2Var(*local_30);
      local_50 = Gia_ManObj(p,iVar1);
    }
    pPlace = (int *)local_50;
  }
  return local_30;
}

Assistant:

static inline int * Gia_ManHashFind( Gia_Man_t * p, int iLit0, int iLit1, int iLitC )
{
    Gia_Obj_t * pThis;
    int * pPlace = p->pHTable + Gia_ManHashOne( iLit0, iLit1, iLitC, p->nHTable );
    assert( p->pMuxes || iLit0 < iLit1 );
    assert( iLit0 < iLit1 || (!Abc_LitIsCompl(iLit0) && !Abc_LitIsCompl(iLit1)) );
    assert( iLitC == -1 || !Abc_LitIsCompl(iLit1) );
    for ( pThis = (*pPlace)? Gia_ManObj(p, Abc_Lit2Var(*pPlace)) : NULL; pThis; 
          pPlace = (int *)&pThis->Value, pThis = (*pPlace)? Gia_ManObj(p, Abc_Lit2Var(*pPlace)) : NULL )
              if ( Gia_ObjFaninLit0p(p, pThis) == iLit0 && Gia_ObjFaninLit1p(p, pThis) == iLit1 && (p->pMuxes == NULL || Gia_ObjFaninLit2p(p, pThis) == iLitC) )
                  break;
    return pPlace;
}